

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int nameNsPush(xmlParserCtxtPtr ctxt,xmlChar *value,xmlChar *prefix,xmlChar *URI,int line,int nsNr)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  xmlStartTag *pxVar3;
  xmlChar **ppxVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = ctxt->nameMax;
  if (ctxt->nameNr < (int)uVar1) {
    if (ctxt->pushTab == (xmlStartTag *)0x0) {
      pxVar3 = (xmlStartTag *)(*xmlMalloc)((long)(int)uVar1 * 0x18);
      ctxt->pushTab = pxVar3;
      if (pxVar3 == (xmlStartTag *)0x0) goto LAB_0013e3cc;
    }
LAB_0013e37c:
    iVar2 = ctxt->nameNr;
    ctxt->nameTab[iVar2] = value;
    ctxt->name = value;
    pxVar3 = ctxt->pushTab;
    pxVar3[iVar2].prefix = prefix;
    pxVar3[iVar2].URI = URI;
    pxVar3[iVar2].line = line;
    pxVar3[iVar2].nsNr = nsNr;
    ctxt->nameNr = iVar2 + 1;
    return iVar2 + 1;
  }
  if ((int)uVar1 < 1) {
    uVar6 = 10;
  }
  else {
    if (999999999 < uVar1) goto LAB_0013e3cc;
    uVar5 = uVar1 + 1 >> 1;
    uVar6 = uVar5 + uVar1;
    if (1000000000 - uVar5 < uVar1) {
      uVar6 = 1000000000;
    }
  }
  ppxVar4 = (xmlChar **)(*xmlRealloc)(ctxt->nameTab,(ulong)uVar6 * 8);
  if (ppxVar4 != (xmlChar **)0x0) {
    ctxt->nameTab = ppxVar4;
    pxVar3 = (xmlStartTag *)(*xmlRealloc)(ctxt->pushTab,(ulong)uVar6 * 0x18);
    if (pxVar3 != (xmlStartTag *)0x0) {
      ctxt->pushTab = pxVar3;
      ctxt->nameMax = uVar6;
      goto LAB_0013e37c;
    }
  }
LAB_0013e3cc:
  xmlCtxtErrMemory(ctxt);
  return extraout_EAX;
}

Assistant:

static int
nameNsPush(xmlParserCtxtPtr ctxt, const xmlChar * value,
           const xmlChar *prefix, const xmlChar *URI, int line, int nsNr)
{
    xmlStartTag *tag;

    if (ctxt->nameNr >= ctxt->nameMax) {
        const xmlChar **tmp;
        xmlStartTag *tmp2;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->nameMax,
                                  sizeof(tmp[0]) + sizeof(tmp2[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0)
            goto mem_error;

        tmp = xmlRealloc(ctxt->nameTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
	    goto mem_error;
	ctxt->nameTab = tmp;

        tmp2 = xmlRealloc(ctxt->pushTab, newSize * sizeof(tmp2[0]));
        if (tmp2 == NULL)
	    goto mem_error;
	ctxt->pushTab = tmp2;

        ctxt->nameMax = newSize;
    } else if (ctxt->pushTab == NULL) {
        ctxt->pushTab = xmlMalloc(ctxt->nameMax * sizeof(ctxt->pushTab[0]));
        if (ctxt->pushTab == NULL)
            goto mem_error;
    }
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    tag = &ctxt->pushTab[ctxt->nameNr];
    tag->prefix = prefix;
    tag->URI = URI;
    tag->line = line;
    tag->nsNr = nsNr;
    return (ctxt->nameNr++);
mem_error:
    xmlErrMemory(ctxt);
    return (-1);
}